

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleFanSet(X3DImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FIReader *pFVar3;
  char *pcVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var9;
  CX3DImporter_NodeElement *pCVar10;
  runtime_error *prVar11;
  byte bVar12;
  string *psVar13;
  int32_t vc;
  X3DImporter *this_00;
  byte bVar14;
  char *__end;
  long lVar15;
  long lVar16;
  int *piVar17;
  CX3DImporter_NodeElement *pCVar18;
  byte bVar19;
  int iVar20;
  ulong uVar21;
  vector<int,_std::allocator<int>_> *this_01;
  string an;
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> fanCount;
  string def;
  string use;
  bool local_d9;
  string local_d8;
  X3DImporter *local_b8;
  CX3DImporter_NodeElement *local_b0;
  allocator<char> local_a1;
  long local_a0;
  int *local_98;
  CX3DImporter_NodeElement *local_90;
  vector<int,_std::allocator<int>_> local_88;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_90 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar7 < 1) {
    bVar19 = 1;
    bVar12 = 1;
    bVar14 = 1;
    local_d9 = true;
  }
  else {
    uVar21 = 0;
    local_d9 = true;
    local_98 = (int *)CONCAT71(local_98._1_7_,1);
    local_b8 = (X3DImporter *)CONCAT71(local_b8._1_7_,1);
    local_b0 = (CX3DImporter_NodeElement *)CONCAT71(local_b0._1_7_,1);
    local_a0 = CONCAT44(local_a0._4_4_,uVar7);
    do {
      pFVar3 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar20 = (int)uVar21;
      iVar8 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar3,uVar21);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,(char *)CONCAT44(extraout_var,iVar8),&local_a1);
      iVar8 = std::__cxx11::string::compare((char *)&local_d8);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar13 = &local_70;
LAB_0066ff59:
        pcVar4 = (char *)psVar13->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar13,0,pcVar4,(ulong)__s);
        uVar7 = (uint)local_a0;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_d8);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar13 = &local_50;
          goto LAB_0066ff59;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_d8);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_d8), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_d8), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_d8);
          if (iVar8 == 0) {
            local_d9 = XML_ReadNode_GetAttrVal_AsBool(this,iVar20);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_d8);
            if (iVar8 == 0) {
              bVar6 = XML_ReadNode_GetAttrVal_AsBool(this,iVar20);
              local_98 = (int *)CONCAT71(local_98._1_7_,bVar6);
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)&local_d8);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,iVar20,&local_88);
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)&local_d8);
                if (iVar8 == 0) {
                  bVar6 = XML_ReadNode_GetAttrVal_AsBool(this,iVar20);
                  local_b0 = (CX3DImporter_NodeElement *)CONCAT71(local_b0._1_7_,bVar6);
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)&local_d8);
                  if (iVar8 == 0) {
                    bVar6 = XML_ReadNode_GetAttrVal_AsBool(this,iVar20);
                    local_b8 = (X3DImporter *)CONCAT71(local_b8._1_7_,bVar6);
                  }
                  else {
                    Throw_IncorrectAttr(this,&local_d8);
                  }
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      uVar21 = (ulong)(iVar20 + 1U);
    } while (uVar7 != iVar20 + 1U);
    bVar14 = (byte)local_98 & 1;
    bVar19 = (byte)local_b0 & 1;
    bVar12 = (byte)local_b8 & 1;
  }
  if (local_50._M_string_length == 0) {
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"TriangleFanSet must contain not empty \"fanCount\" attribute."
                 ,"");
      std::runtime_error::runtime_error(prVar11,(string *)&local_d8);
      *(undefined ***)prVar11 = &PTR__runtime_error_007da4b8;
      __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pCVar10 = (CX3DImporter_NodeElement *)operator_new(0xd8);
    pCVar18 = this->NodeElement_Cur;
    pCVar10->Type = 0x20;
    (pCVar10->ID)._M_dataplus._M_p = (pointer)&(pCVar10->ID).field_2;
    (pCVar10->ID)._M_string_length = 0;
    (pCVar10->ID).field_2._M_local_buf[0] = '\0';
    pCVar10->Parent = pCVar18;
    (pCVar10->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pCVar10->Child;
    (pCVar10->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pCVar10->Child;
    (pCVar10->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    *(CX3DImporter_NodeElement **)&pCVar10[1].Type = pCVar10 + 1;
    pCVar10[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(pCVar10 + 1);
    pCVar10[1].ID._M_dataplus._M_p = (pointer)0x0;
    pCVar10[1].ID._M_string_length = 0;
    pCVar10[1].ID.field_2._M_local_buf[0] = '\x01';
    pCVar10->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Set_008a89c0;
    *(undefined8 *)((long)&pCVar10[1].ID.field_2 + 8) = 0;
    pCVar10[1].Parent = (CX3DImporter_NodeElement *)0x0;
    pCVar10[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pCVar10[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    pCVar10[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pCVar10[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(_List_node_base **)&pCVar10[2].Type = (_List_node_base *)0x0;
    pCVar10[2].ID._M_dataplus._M_p = (pointer)0x0;
    pCVar10[2].ID._M_string_length = 0;
    pCVar10[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pCVar10[2].ID.field_2 + 8) = 0;
    pCVar10[2].Parent = (CX3DImporter_NodeElement *)0x0;
    local_90 = pCVar10;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pCVar10->ID);
    }
    pCVar10[1].ID.field_2._M_local_buf[1] = local_d9;
    pCVar10[1].ID.field_2._M_local_buf[2] = bVar14;
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&pCVar10[2].ID.field_2,&local_88);
    pCVar10[1].ID.field_2._M_local_buf[3] = bVar19;
    pCVar10[1].ID.field_2._M_local_buf[0] = bVar12;
    pCVar18 = *(CX3DImporter_NodeElement **)((long)&pCVar10[1].ID.field_2 + 8);
    if (pCVar10[1].Parent != pCVar18) {
      pCVar10[1].Parent = pCVar18;
    }
    piVar17 = *(int **)&pCVar10[2].ID.field_2;
    local_b8 = this;
    local_b0 = pCVar10;
    if (piVar17 != *(int **)((long)&pCVar10[2].ID.field_2 + 8)) {
      this_01 = (vector<int,_std::allocator<int>_> *)
                (&pCVar10[1].ID.field_2._M_allocated_capacity + 1);
      lVar15 = 1;
      local_a0 = 0;
      do {
        if (*piVar17 < 3) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,
                     "TriangleFanSet. fanCount shall be greater than or equal to three.","");
          std::runtime_error::runtime_error(prVar11,(string *)&local_d8);
          *(undefined ***)prVar11 = &PTR__runtime_error_007da4b8;
          __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar8 = 2;
        local_98 = piVar17;
        do {
          lVar16 = lVar15;
          iVar20 = (int)lVar16;
          local_d8._M_dataplus._M_p._0_4_ = (int)local_a0;
          if (local_d9 == false) {
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_d8);
            local_d8._M_dataplus._M_p._0_4_ = iVar20 + 1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_d8);
            local_d8._M_dataplus._M_p._0_4_ = iVar20;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_d8);
            piVar17 = local_98;
          }
          else {
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_d8);
            local_d8._M_dataplus._M_p._0_4_ = iVar20;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_d8);
            local_d8._M_dataplus._M_p._0_4_ = iVar20 + 1;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_d8);
          }
          local_d8._M_dataplus._M_p._0_4_ = 0xffffffff;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_d8);
          iVar8 = iVar8 + 1;
          lVar15 = lVar16 + 1;
        } while (iVar8 < *piVar17);
        local_a0 = lVar16 + 2;
        lVar15 = lVar16 + 3;
        piVar17 = piVar17 + 1;
      } while (piVar17 != *(int **)((long)&local_b0[2].ID.field_2 + 8));
    }
    this_00 = local_b8;
    iVar8 = (*(((local_b8->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar18 = local_b0;
    if ((char)iVar8 == '\0') {
      ParseHelper_Node_Enter(this_00,local_b0);
      paVar2 = &local_d8.field_2;
      do {
        do {
          while( true ) {
            iVar8 = (*(((this_00->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar8 == '\0') {
              local_d8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,"TriangleFanSet","");
              Throw_CloseNotFound(this_00,&local_d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_0067066d;
            }
            iVar8 = (*(((this_00->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar8 != 1) break;
            local_d8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Color","");
            (*(((this_00->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar8 = std::__cxx11::string::compare((char *)&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != paVar2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            this_00 = local_b8;
            if (iVar8 == 0) {
              ParseNode_Rendering_Color(local_b8);
            }
            else {
              local_d8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"ColorRGBA","");
              (*(((local_b8->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar8 = std::__cxx11::string::compare((char *)&local_d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != paVar2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              this_00 = local_b8;
              if (iVar8 == 0) {
                ParseNode_Rendering_ColorRGBA(local_b8);
              }
              else {
                local_d8._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Coordinate","")
                ;
                (*(((local_b8->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar8 = std::__cxx11::string::compare((char *)&local_d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                this_00 = local_b8;
                if (iVar8 == 0) {
                  ParseNode_Rendering_Coordinate(local_b8);
                }
                else {
                  local_d8._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Normal","");
                  (*(((local_b8->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar8 = std::__cxx11::string::compare((char *)&local_d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_dataplus._M_p != paVar2) {
                    operator_delete(local_d8._M_dataplus._M_p,
                                    local_d8.field_2._M_allocated_capacity + 1);
                  }
                  this_00 = local_b8;
                  if (iVar8 == 0) {
                    ParseNode_Rendering_Normal(local_b8);
                  }
                  else {
                    local_d8._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_d8,"TextureCoordinate","");
                    (*(((local_b8->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar8 = std::__cxx11::string::compare((char *)&local_d8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d8._M_dataplus._M_p != paVar2) {
                      operator_delete(local_d8._M_dataplus._M_p,
                                      local_d8.field_2._M_allocated_capacity + 1);
                    }
                    this_00 = local_b8;
                    if (iVar8 == 0) {
                      ParseNode_Texturing_TextureCoordinate(local_b8);
                    }
                    else {
                      bVar6 = ParseHelper_CheckRead_X3DMetadataObject(local_b8);
                      if (!bVar6) {
                        local_d8._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_d8,"TriangleFanSet","");
                        XML_CheckNode_SkipUnsupported(this_00,&local_d8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d8._M_dataplus._M_p != paVar2) {
                          operator_delete(local_d8._M_dataplus._M_p,
                                          local_d8.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar8 = (*(((this_00->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar8 != 2);
        local_d8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"TriangleFanSet","");
        (*(((this_00->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar8 = std::__cxx11::string::compare((char *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        this_00 = local_b8;
      } while (iVar8 != 0);
LAB_0067066d:
      ParseHelper_Node_Exit(this_00);
      pCVar18 = local_b0;
    }
    else {
      pCVar10 = this_00->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)pCVar18;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar10->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)pCVar18;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this_00->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_50,ENET_TriangleFanSet,&local_90);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar18 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_90;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar18->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleFanSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> fanCount;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("fanCount", fanCount, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleFanSet, ne);
	}
	else
	{
		// check data
		if(fanCount.size() == 0) throw DeadlyImportError("TriangleFanSet must contain not empty \"fanCount\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Set(CX3DImporter_NodeElement::ENET_TriangleFanSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.VertexCount = fanCount;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
		// create CoordIdx
		size_t coord_num_first, coord_num_prev;

		ne_alias.CoordIndex.clear();
		// assign indices for first triangle
		coord_num_first = 0;
		coord_num_prev = 1;
		for(std::vector<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); ++vc_it)
		{
			if(*vc_it < 3) throw DeadlyImportError("TriangleFanSet. fanCount shall be greater than or equal to three.");

			for(int32_t vc = 2; vc < *vc_it; vc++)
			{
				if(ccw)
				{
					// 2 1
					//  0
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_first));// first vertex is a center and always is [0].
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev++));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev));
				}
				else
				{
					// 1 2
					//  0
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_first));// first vertex is a center and always is [0].
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev + 1));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev++));
				}// if(ccw) else

				ne_alias.CoordIndex.push_back(-1);// add face delimiter.
			}// for(int32_t vc = 2; vc < *vc_it; vc++)

			coord_num_prev++;// that index will be center of next fan
			coord_num_first = coord_num_prev++;// forward to next point - second point of fan
		}// for(std::list<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); vc_it++)
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleFanSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleFanSet");

			MACRO_NODECHECK_LOOPEND("TriangleFanSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}